

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcIShapeProfileDef::~IfcIShapeProfileDef(IfcIShapeProfileDef *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x58 =
       0x93fa28;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.ProfileName.ptr.field_2.
  _M_allocated_capacity = 0x93fa50;
  if ((Out *)this[-1].OverallDepth != &this[-1].FlangeThickness) {
    operator_delete((undefined1 *)this[-1].OverallDepth,(long)this[-1].FlangeThickness + 1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68
  ;
  puVar2 = &this[-1].super_IfcParameterizedProfileDef.field_0x78;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  operator_delete(&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x58,200);
  return;
}

Assistant:

IfcIShapeProfileDef() : Object("IfcIShapeProfileDef") {}